

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

Edge * __thiscall Graph::addEdge(Graph *this,int from,int to,Edge *edge)

{
  pointer *pppEVar1;
  vector<Edge*,std::allocator<Edge*>> *pvVar2;
  pointer ppEVar3;
  iterator iVar4;
  __hashtable *__h;
  Edge *pEVar5;
  pointer pvVar6;
  pointer ppEVar7;
  __node_gen_type __node_gen;
  Edge *local_48;
  key_type local_40;
  _Hashtable<Edge_const*,Edge_const*,std::allocator<Edge_const*>,std::__detail::_Identity,std::equal_to<Edge_const*>,std::hash<Edge_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  pvVar6 = (this->adjList).
           super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppEVar7 = *(pointer *)&pvVar6[from].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl;
  ppEVar3 = *(pointer *)
             ((long)&pvVar6[from].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8);
  local_48 = edge;
  if (ppEVar7 != ppEVar3) {
    do {
      pEVar5 = Edge::addNeighbour(edge,*ppEVar7);
      Edge::addNeighbour(pEVar5,edge);
      ppEVar7 = ppEVar7 + 1;
    } while (ppEVar7 != ppEVar3);
    pvVar6 = (this->adjList).
             super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  ppEVar7 = *(pointer *)&pvVar6[to].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl;
  ppEVar3 = *(pointer *)
             ((long)&pvVar6[to].super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8);
  if (ppEVar7 != ppEVar3) {
    do {
      pEVar5 = Edge::addNeighbour(edge,*ppEVar7);
      Edge::addNeighbour(pEVar5,edge);
      ppEVar7 = ppEVar7 + 1;
    } while (ppEVar7 != ppEVar3);
    pvVar6 = (this->adjList).
             super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pvVar2 = (vector<Edge*,std::allocator<Edge*>> *)(pvVar6 + from);
  iVar4._M_current = *(Edge ***)(pvVar2 + 8);
  if (iVar4._M_current == *(Edge ***)(pvVar2 + 0x10)) {
    std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>(pvVar2,iVar4,&local_48)
    ;
  }
  else {
    *iVar4._M_current = edge;
    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
  }
  pvVar2 = (vector<Edge*,std::allocator<Edge*>> *)
           ((this->adjList).
            super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + to);
  iVar4._M_current = *(Edge ***)(pvVar2 + 8);
  if (iVar4._M_current == *(Edge ***)(pvVar2 + 0x10)) {
    std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>(pvVar2,iVar4,&local_48)
    ;
  }
  else {
    *iVar4._M_current = local_48;
    *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
  }
  iVar4._M_current =
       (this->edges).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->edges).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
              ((vector<Edge*,std::allocator<Edge*>> *)&this->edges,iVar4,&local_48);
  }
  else {
    *iVar4._M_current = local_48;
    pppEVar1 = &(this->edges).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  local_40 = (key_type)local_48->ttd;
  local_38 = (_Hashtable<Edge_const*,Edge_const*,std::allocator<Edge_const*>,std::__detail::_Identity,std::equal_to<Edge_const*>,std::hash<Edge_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<const_Edge_*,_std::hash<const_Edge_*>,_std::equal_to<const_Edge_*>,_std::allocator<const_Edge_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->ttds,&local_40);
  std::
  _Hashtable<Edge_const*,Edge_const*,std::allocator<Edge_const*>,std::__detail::_Identity,std::equal_to<Edge_const*>,std::hash<Edge_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<Edge_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Edge_const*,false>>>>
            (local_38,&local_48);
  return (*(pointer *)
           ((long)&(this->adjList).
                   super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[from].
                   super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl + 8))[-1];
}

Assistant:

const Edge& Graph::addEdge(int from, int to, Edge* edge) {
  for(Edge* neighbour: adjList[from]) {
    edge->addNeighbour(neighbour)->addNeighbour(edge);
  }
  for(Edge* neighbour: adjList[to]) {
    edge->addNeighbour(neighbour)->addNeighbour(edge);
  }
  adjList[from].push_back(edge);
  adjList[to].push_back(edge);
  edges.push_back(edge);
  ttds[edge->ttd].insert(edge);
  return *adjList[from].back();
}